

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

void llvm::SmallVectorTemplateBase<llvm::DWARFDebugNames::NameIndex,_false>::destroy_range
               (NameIndex *S,NameIndex *E)

{
  while (E != S) {
    E = E + -1;
    DWARFDebugNames::NameIndex::~NameIndex(E);
  }
  return;
}

Assistant:

static void destroy_range(T *S, T *E) {
    while (S != E) {
      --E;
      E->~T();
    }
  }